

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::print_xformOpOrder_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,
          vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *xformOps,uint32_t indent)

{
  undefined8 uVar1;
  size_type sVar2;
  ostream *poVar3;
  const_reference pvVar4;
  ulong uVar5;
  uint32_t n;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 uVar7;
  string local_260;
  undefined1 local_240 [8];
  value_type xformOp;
  size_t i;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [380];
  uint local_1c;
  tinyusdz *ptStack_18;
  uint32_t indent_local;
  vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *xformOps_local;
  
  local_1c = (uint)xformOps;
  ptStack_18 = this;
  xformOps_local =
       (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  sVar2 = ::std::vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>::size
                    ((vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)ptStack_18);
  if (sVar2 != 0) {
    pprint::Indent_abi_cxx11_((string *)&i,(pprint *)(ulong)local_1c,n);
    poVar3 = ::std::operator<<(aoStack_198,(string *)&i);
    ::std::operator<<(poVar3,"uniform token[] xformOpOrder = [");
    ::std::__cxx11::string::~string((string *)&i);
    xformOp._is_blocked = false;
    xformOp._105_7_ = 0;
    while( true ) {
      uVar1 = xformOp._104_8_;
      sVar2 = ::std::vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>::size
                        ((vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)ptStack_18
                        );
      if (sVar2 <= (ulong)uVar1) break;
      if (xformOp._104_8_ != 0) {
        ::std::operator<<(aoStack_198,", ");
      }
      pvVar4 = ::std::vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>::operator[]
                         ((vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)
                          ptStack_18,xformOp._104_8_);
      XformOp::XformOp((XformOp *)local_240,pvVar4);
      ::std::operator<<(aoStack_198,"\"");
      uVar6 = extraout_EDX;
      uVar7 = extraout_var;
      if ((local_240[4] & 1U) != 0) {
        ::std::operator<<(aoStack_198,"!invert!");
        uVar6 = extraout_EDX_00;
        uVar7 = extraout_var_00;
      }
      to_string_abi_cxx11_(&local_260,(tinyusdz *)local_240,(OpType *)CONCAT44(uVar7,uVar6));
      ::std::operator<<(aoStack_198,(string *)&local_260);
      ::std::__cxx11::string::~string((string *)&local_260);
      uVar5 = ::std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        poVar3 = ::std::operator<<(aoStack_198,":");
        ::std::operator<<(poVar3,(string *)&xformOp);
      }
      ::std::operator<<(aoStack_198,"\"");
      XformOp::~XformOp((XformOp *)local_240);
      xformOp._104_8_ = xformOp._104_8_ + 1;
    }
    ::std::operator<<(aoStack_198,"]\n");
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_xformOpOrder(const std::vector<XformOp> &xformOps,
                               const uint32_t indent) {
  std::stringstream ss;

  if (xformOps.size()) {
    ss << pprint::Indent(indent) << "uniform token[] xformOpOrder = [";
    for (size_t i = 0; i < xformOps.size(); i++) {
      if (i > 0) {
        ss << ", ";
      }

      auto xformOp = xformOps[i];
      ss << "\"";
      if (xformOp.inverted) {
        ss << "!invert!";
      }
      ss << to_string(xformOp.op_type);
      if (!xformOp.suffix.empty()) {
        ss << ":" << xformOp.suffix;
      }
      ss << "\"";
    }
    ss << "]\n";
  }

  return ss.str();
}